

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d3d.cpp
# Opt level: O0

void rw::d3d::rasterUnlock(Raster *raster,int32 level)

{
  int32 level_local;
  Raster *raster_local;
  
  raster->width = raster->originalWidth;
  raster->height = raster->originalHeight;
  raster->stride = raster->originalStride;
  raster->pixels = raster->originalPixels;
  raster->privateFlags = raster->privateFlags & 0xfffffff9;
  return;
}

Assistant:

void
rasterUnlock(Raster *raster, int32 level)
{
#if RW_D3D9
	D3dRaster *natras = GETD3DRASTEREXT(raster);
	IDirect3DSurface9 *surf = (IDirect3DSurface9*)natras->lockedSurf;
	surf->UnlockRect();
	surf->Release();
	natras->lockedSurf = nil;
#endif
	raster->width = raster->originalWidth;
	raster->height = raster->originalHeight;
	raster->stride = raster->originalStride;
	raster->pixels = raster->originalPixels;

	raster->privateFlags &= ~(Raster::PRIVATELOCK_READ|Raster::PRIVATELOCK_WRITE);
}